

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void __thiscall
CUI::DoLabelSelected(CUI *this,CUIRect *pRect,char *pText,bool Selected,float FontSize,int Align)

{
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,Selected) != 0) {
    (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[4])(0,0,0,0x3f800000);
    (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[5])
              (0x3f800000,0x3f800000,0x3f800000,0x3e800000);
    DoLabel(this,pRect,pText,FontSize,Align,-1.0,true);
    (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[5])(0,0,0,0x3e99999a);
    return;
  }
  DoLabel(this,pRect,pText,FontSize,Align,-1.0,true);
  return;
}

Assistant:

void CUI::DoLabelSelected(const CUIRect *pRect, const char *pText, bool Selected, float FontSize, int Align)
{
	if(Selected)
	{
		TextRender()->TextColor(CUI::ms_HighlightTextColor);
		TextRender()->TextSecondaryColor(CUI::ms_HighlightTextOutlineColor);
	}
	DoLabel(pRect, pText, FontSize, Align);
	if(Selected)
	{
		TextRender()->TextColor(CUI::ms_DefaultTextColor);
		TextRender()->TextSecondaryColor(CUI::ms_DefaultTextOutlineColor);
	}
}